

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::EdgeCircumcenterSign(S2Point *x0,S2Point *x1,S2Point *a,S2Point *b,S2Point *c)

{
  bool bVar1;
  ostream *poVar2;
  Vector3_xf local_268;
  Vector3_xf local_238;
  Vector3_xf local_208;
  Vector3_xf local_1d8;
  Vector3_xf local_1a8;
  Vector3_ld local_178;
  Vector3_ld local_148;
  Vector3_ld local_118;
  Vector3_ld local_e8;
  Vector3_ld local_b8;
  int local_84;
  int local_80;
  int sign;
  int abc_sign;
  byte local_69;
  S2LogMessage local_68;
  S2LogMessageVoidify local_51;
  D local_50;
  BasicVector<Vector3,_double,_3UL> *local_38;
  S2Point *c_local;
  S2Point *b_local;
  S2Point *a_local;
  S2Point *x1_local;
  S2Point *x0_local;
  
  local_38 = (BasicVector<Vector3,_double,_3UL> *)c;
  c_local = b;
  b_local = a;
  a_local = x1;
  x1_local = x0;
  util::math::internal_vector::operator-(&local_50,x1);
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                    ((BasicVector<Vector3,_double,_3UL> *)x0,&local_50);
  local_69 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x426,kFatal,(ostream *)&std::cerr);
    local_69 = 1;
    poVar2 = S2LogMessage::stream(&local_68);
    poVar2 = std::operator<<(poVar2,"Check failed: (x0) != (-x1) ");
    S2LogMessageVoidify::operator&(&local_51,poVar2);
  }
  if ((local_69 & 1) == 0) {
    local_80 = Sign(b_local,c_local,(S2Point *)local_38);
    local_84 = TriageEdgeCircumcenterSign<double>
                         (x1_local,a_local,b_local,c_local,(Vector3<double> *)local_38,local_80);
    x0_local._4_4_ = local_84;
    if (local_84 == 0) {
      bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                        ((BasicVector<Vector3,_double,_3UL> *)x1_local,a_local);
      if ((((bVar1) ||
           (bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                              ((BasicVector<Vector3,_double,_3UL> *)b_local,c_local), bVar1)) ||
          (bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                             ((BasicVector<Vector3,_double,_3UL> *)c_local,(D *)local_38), bVar1))
         || (bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                               (local_38,b_local), bVar1)) {
        x0_local._4_4_ = 0;
      }
      else {
        ToLD(&local_b8,x1_local);
        ToLD(&local_e8,a_local);
        ToLD(&local_118,b_local);
        ToLD(&local_148,c_local);
        ToLD(&local_178,(S2Point *)local_38);
        local_84 = TriageEdgeCircumcenterSign<long_double>
                             (&local_b8,&local_e8,&local_118,&local_148,&local_178,local_80);
        x0_local._4_4_ = local_84;
        if (local_84 == 0) {
          ToExact(&local_1a8,x1_local);
          ToExact(&local_1d8,a_local);
          ToExact(&local_208,b_local);
          ToExact(&local_238,c_local);
          ToExact(&local_268,(S2Point *)local_38);
          local_84 = ExactEdgeCircumcenterSign
                               (&local_1a8,&local_1d8,&local_208,&local_238,&local_268,local_80);
          Vector3<ExactFloat>::~Vector3(&local_268);
          Vector3<ExactFloat>::~Vector3(&local_238);
          Vector3<ExactFloat>::~Vector3(&local_208);
          Vector3<ExactFloat>::~Vector3(&local_1d8);
          Vector3<ExactFloat>::~Vector3(&local_1a8);
          if (local_84 == 0) {
            x0_local._4_4_ =
                 SymbolicEdgeCircumcenterSign(x1_local,a_local,b_local,c_local,(S2Point *)local_38);
          }
          else {
            x0_local._4_4_ = local_84;
          }
        }
      }
    }
    return x0_local._4_4_;
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_68);
}

Assistant:

int EdgeCircumcenterSign(const S2Point& x0, const S2Point& x1,
                         const S2Point& a, const S2Point& b,
                         const S2Point& c) {
  // Check that the edge does not consist of antipodal points.  (This catches
  // the most common case -- the full test is in ExactEdgeCircumcenterSign.)
  S2_DCHECK_NE(x0, -x1);

  int abc_sign = Sign(a, b, c);
  int sign = TriageEdgeCircumcenterSign(x0, x1, a, b, c, abc_sign);
  if (sign != 0) return sign;

  // Optimization for the cases that are going to return zero anyway, in order
  // to avoid falling back to exact arithmetic.
  if (x0 == x1 || a == b || b == c || c == a) return 0;

  sign = TriageEdgeCircumcenterSign(
      ToLD(x0), ToLD(x1), ToLD(a), ToLD(b), ToLD(c), abc_sign);
  if (sign != 0) return sign;
  sign = ExactEdgeCircumcenterSign(
      ToExact(x0), ToExact(x1), ToExact(a), ToExact(b), ToExact(c), abc_sign);
  if (sign != 0) return sign;

  // Unlike the other methods, SymbolicEdgeCircumcenterSign does not depend
  // on the sign of triangle ABC.
  return SymbolicEdgeCircumcenterSign(x0, x1, a, b, c);
}